

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O3

vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> * __thiscall
xmrig::OclPlatform::devices
          (vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *__return_storage_ptr__,
          OclPlatform *this)

{
  cl_uint num_devices;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> devices;
  cl_uint local_4c;
  unsigned_long local_48;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> local_40;
  cl_platform_id local_28;
  
  (__return_storage_ptr__->super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_id != (cl_platform_id)0x0) {
    local_4c = 0;
    OclLib::getDeviceIDs(this->m_id,4,0,(cl_device_id *)0x0,&local_4c);
    if ((ulong)local_4c != 0) {
      std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::reserve
                (__return_storage_ptr__,(ulong)local_4c);
      std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::vector
                (&local_40,(ulong)local_4c,(allocator_type *)&local_48);
      OclLib::getDeviceIDs
                (this->m_id,4,local_4c,
                 local_40.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
      local_48 = 0;
      if (local_40.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_40.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          local_28 = this->m_id;
          std::vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>>::
          emplace_back<unsigned_long&,_cl_device_id*&,_cl_platform_id*>
                    ((vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>> *)
                     __return_storage_ptr__,&local_48,
                     local_40.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                     _M_impl.super__Vector_impl_data._M_start + local_48,&local_28);
          local_48 = local_48 + 1;
        } while (local_48 <
                 (ulong)((long)local_40.
                               super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_40.
                               super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_40.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
          super__Vector_impl_data._M_start != (cl_device_id *)0x0) {
        operator_delete(local_40.
                        super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::OclDevice> xmrig::OclPlatform::devices() const
{
    std::vector<OclDevice> out;
    if (!isValid()) {
        return out;
    }

    cl_uint num_devices = 0;
    OclLib::getDeviceIDs(id(), CL_DEVICE_TYPE_GPU, 0, nullptr, &num_devices);
    if (num_devices == 0) {
        return out;
    }

    out.reserve(num_devices);
    std::vector<cl_device_id> devices(num_devices);
    OclLib::getDeviceIDs(id(), CL_DEVICE_TYPE_GPU, num_devices, devices.data(), nullptr);

    for (size_t i = 0; i < devices.size(); ++i) {
        out.emplace_back(i, devices[i], id());
    }

    return out;
}